

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O3

word Extra_Truth6MinimumHeuristic(word t)

{
  ulong uVar1;
  long lVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  int k;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *puVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  
  uVar1 = (t >> 1 & 0x5555555555555555) + (t & 0x5555555555555555);
  uVar1 = (uVar1 >> 2 & 0x3333333333333333) + (uVar1 & 0x3333333333333333);
  uVar1 = (uVar1 >> 4 & 0x707070707070707) + (uVar1 & 0x707070707070707);
  uVar1 = (uVar1 >> 8 & 0xf000f000f000f) + (uVar1 & 0xf000f000f000f);
  lVar2 = (uVar1 >> 0x10 & 0x1f0000001f) + (uVar1 & 0x1f0000001f);
  uVar5 = (int)((ulong)lVar2 >> 0x20) + (int)lVar2;
  if (uVar5 < 0x20) {
    iVar6 = 0;
    do {
      lVar2 = 4;
      puVar10 = (ulong *)(Extra_Truth6SwapAdjacent_PMasks + 0x70);
      uVar1 = t;
      uVar12 = 0xffffffff00000000;
      do {
        uVar11 = *(ulong *)(Extra_Truth6ChangePhase_Truth6 + lVar2 * 8);
        uVar9 = ~uVar11;
        bVar3 = (byte)(1 << ((byte)lVar2 & 0x1f));
        uVar13 = (uVar11 & uVar1) >> (bVar3 & 0x3f) | (uVar1 & uVar9) << (bVar3 & 0x3f);
        if (uVar1 < uVar13) {
          uVar13 = uVar1;
        }
        bVar4 = (byte)(2 << ((byte)lVar2 & 0x1f));
        uVar7 = (uVar12 & uVar1) >> (bVar4 & 0x3f) | (uVar1 & ~uVar12) << (bVar4 & 0x3f);
        if (uVar7 <= uVar13) {
          uVar13 = uVar7;
        }
        uVar7 = (uVar7 & uVar11) >> (bVar3 & 0x3f) | (uVar7 & uVar9) << (bVar3 & 0x3f);
        if (uVar13 < uVar7) {
          uVar7 = uVar13;
        }
        uVar1 = (uVar1 & *puVar10) >> (bVar3 & 0x3f) |
                (puVar10[-1] & uVar1) << (bVar3 & 0x3f) | puVar10[-2] & uVar1;
        if (uVar1 <= uVar7) {
          uVar7 = uVar1;
        }
        uVar13 = (uVar1 & uVar11) >> (bVar3 & 0x3f) | (uVar1 & uVar9) << (bVar3 & 0x3f);
        if (uVar7 < uVar13) {
          uVar13 = uVar7;
        }
        uVar1 = (uVar1 & uVar12) >> (bVar4 & 0x3f) | (~uVar12 & uVar1) << (bVar4 & 0x3f);
        if (uVar1 <= uVar13) {
          uVar13 = uVar1;
        }
        uVar1 = (uVar1 & uVar11) >> (bVar3 & 0x3f) | (uVar9 & uVar1) << (bVar3 & 0x3f);
        if (uVar13 < uVar1) {
          uVar1 = uVar13;
        }
        puVar10 = puVar10 + -3;
        bVar14 = lVar2 != 0;
        lVar2 = lVar2 + -1;
        uVar12 = uVar11;
      } while (bVar14);
    } while ((t != uVar1) && (iVar6 = iVar6 + 1, t = uVar1, iVar6 != 10));
  }
  else if (uVar5 == 0x20) {
    iVar6 = 0;
    uVar1 = t;
    do {
      lVar2 = 4;
      puVar10 = (ulong *)(Extra_Truth6SwapAdjacent_PMasks + 0x70);
      uVar12 = 0xffffffff00000000;
      uVar11 = uVar1;
      do {
        uVar13 = *(ulong *)(Extra_Truth6ChangePhase_Truth6 + lVar2 * 8);
        uVar7 = ~uVar13;
        bVar3 = (byte)(1 << ((byte)lVar2 & 0x1f));
        uVar9 = (uVar13 & uVar11) >> (bVar3 & 0x3f) | (uVar11 & uVar7) << (bVar3 & 0x3f);
        if (uVar11 < uVar9) {
          uVar9 = uVar11;
        }
        bVar4 = (byte)(2 << ((byte)lVar2 & 0x1f));
        uVar8 = (uVar12 & uVar11) >> (bVar4 & 0x3f) | (uVar11 & ~uVar12) << (bVar4 & 0x3f);
        if (uVar8 <= uVar9) {
          uVar9 = uVar8;
        }
        uVar8 = (uVar8 & uVar13) >> (bVar3 & 0x3f) | (uVar8 & uVar7) << (bVar3 & 0x3f);
        if (uVar9 < uVar8) {
          uVar8 = uVar9;
        }
        uVar11 = (uVar11 & *puVar10) >> (bVar3 & 0x3f) |
                 (puVar10[-1] & uVar11) << (bVar3 & 0x3f) | puVar10[-2] & uVar11;
        if (uVar11 <= uVar8) {
          uVar8 = uVar11;
        }
        uVar9 = (uVar11 & uVar13) >> (bVar3 & 0x3f) | (uVar11 & uVar7) << (bVar3 & 0x3f);
        if (uVar8 < uVar9) {
          uVar9 = uVar8;
        }
        uVar12 = (uVar11 & uVar12) >> (bVar4 & 0x3f) | (~uVar12 & uVar11) << (bVar4 & 0x3f);
        if (uVar12 <= uVar9) {
          uVar9 = uVar12;
        }
        uVar11 = (uVar12 & uVar13) >> (bVar3 & 0x3f) | (uVar7 & uVar12) << (bVar3 & 0x3f);
        if (uVar9 < uVar11) {
          uVar11 = uVar9;
        }
        puVar10 = puVar10 + -3;
        bVar14 = lVar2 != 0;
        lVar2 = lVar2 + -1;
        uVar12 = uVar13;
      } while (bVar14);
    } while ((uVar1 != uVar11) && (iVar6 = iVar6 + 1, uVar1 = uVar11, iVar6 != 10));
    iVar6 = 0;
    t = ~t;
    do {
      lVar2 = 4;
      puVar10 = (ulong *)(Extra_Truth6SwapAdjacent_PMasks + 0x70);
      uVar12 = t;
      uVar11 = 0xffffffff00000000;
      do {
        uVar13 = *(ulong *)(Extra_Truth6ChangePhase_Truth6 + lVar2 * 8);
        uVar7 = ~uVar13;
        bVar3 = (byte)(1 << ((byte)lVar2 & 0x1f));
        uVar9 = (uVar13 & uVar12) >> (bVar3 & 0x3f) | (uVar12 & uVar7) << (bVar3 & 0x3f);
        if (uVar12 < uVar9) {
          uVar9 = uVar12;
        }
        bVar4 = (byte)(2 << ((byte)lVar2 & 0x1f));
        uVar8 = (uVar11 & uVar12) >> (bVar4 & 0x3f) | (uVar12 & ~uVar11) << (bVar4 & 0x3f);
        if (uVar8 <= uVar9) {
          uVar9 = uVar8;
        }
        uVar8 = (uVar8 & uVar13) >> (bVar3 & 0x3f) | (uVar8 & uVar7) << (bVar3 & 0x3f);
        if (uVar9 < uVar8) {
          uVar8 = uVar9;
        }
        uVar12 = (uVar12 & *puVar10) >> (bVar3 & 0x3f) |
                 (puVar10[-1] & uVar12) << (bVar3 & 0x3f) | puVar10[-2] & uVar12;
        if (uVar12 <= uVar8) {
          uVar8 = uVar12;
        }
        uVar9 = (uVar12 & uVar13) >> (bVar3 & 0x3f) | (uVar12 & uVar7) << (bVar3 & 0x3f);
        if (uVar8 < uVar9) {
          uVar9 = uVar8;
        }
        uVar12 = (uVar12 & uVar11) >> (bVar4 & 0x3f) | (~uVar11 & uVar12) << (bVar4 & 0x3f);
        if (uVar12 <= uVar9) {
          uVar9 = uVar12;
        }
        uVar12 = (uVar12 & uVar13) >> (bVar3 & 0x3f) | (uVar7 & uVar12) << (bVar3 & 0x3f);
        if (uVar9 < uVar12) {
          uVar12 = uVar9;
        }
        puVar10 = puVar10 + -3;
        bVar14 = lVar2 != 0;
        lVar2 = lVar2 + -1;
        uVar11 = uVar13;
      } while (bVar14);
    } while ((t != uVar12) && (iVar6 = iVar6 + 1, t = uVar12, iVar6 != 10));
    if (uVar1 < t) {
      t = uVar1;
    }
  }
  else {
    iVar6 = 0;
    t = ~t;
    do {
      lVar2 = 4;
      puVar10 = (ulong *)(Extra_Truth6SwapAdjacent_PMasks + 0x70);
      uVar1 = t;
      uVar12 = 0xffffffff00000000;
      do {
        uVar11 = *(ulong *)(Extra_Truth6ChangePhase_Truth6 + lVar2 * 8);
        uVar9 = ~uVar11;
        bVar3 = (byte)(1 << ((byte)lVar2 & 0x1f));
        uVar13 = (uVar11 & uVar1) >> (bVar3 & 0x3f) | (uVar1 & uVar9) << (bVar3 & 0x3f);
        if (uVar1 < uVar13) {
          uVar13 = uVar1;
        }
        bVar4 = (byte)(2 << ((byte)lVar2 & 0x1f));
        uVar7 = (uVar12 & uVar1) >> (bVar4 & 0x3f) | (uVar1 & ~uVar12) << (bVar4 & 0x3f);
        if (uVar7 <= uVar13) {
          uVar13 = uVar7;
        }
        uVar7 = (uVar7 & uVar11) >> (bVar3 & 0x3f) | (uVar7 & uVar9) << (bVar3 & 0x3f);
        if (uVar13 < uVar7) {
          uVar7 = uVar13;
        }
        uVar1 = (uVar1 & *puVar10) >> (bVar3 & 0x3f) |
                (puVar10[-1] & uVar1) << (bVar3 & 0x3f) | puVar10[-2] & uVar1;
        if (uVar1 <= uVar7) {
          uVar7 = uVar1;
        }
        uVar13 = (uVar1 & uVar11) >> (bVar3 & 0x3f) | (uVar1 & uVar9) << (bVar3 & 0x3f);
        if (uVar7 < uVar13) {
          uVar13 = uVar7;
        }
        uVar1 = (uVar1 & uVar12) >> (bVar4 & 0x3f) | (~uVar12 & uVar1) << (bVar4 & 0x3f);
        if (uVar1 <= uVar13) {
          uVar13 = uVar1;
        }
        uVar1 = (uVar1 & uVar11) >> (bVar3 & 0x3f) | (uVar9 & uVar1) << (bVar3 & 0x3f);
        if (uVar13 < uVar1) {
          uVar1 = uVar13;
        }
        puVar10 = puVar10 + -3;
        bVar14 = lVar2 != 0;
        lVar2 = lVar2 + -1;
        uVar12 = uVar11;
      } while (bVar14);
    } while ((t != uVar1) && (iVar6 = iVar6 + 1, t = uVar1, iVar6 != 10));
  }
  return t;
}

Assistant:

word Extra_Truth6MinimumHeuristic( word t )
{
    word tMin1, tMin2;
    int nOnes = Extra_Truth6Ones( t );
    if ( nOnes < 32 )
        return Extra_Truth6MinimumRoundMany( t );
    if ( nOnes > 32 )
        return Extra_Truth6MinimumRoundMany( ~t );
    tMin1 = Extra_Truth6MinimumRoundMany(  t );
    tMin2 = Extra_Truth6MinimumRoundMany( ~t );
    return Abc_MinWord( tMin1, tMin2 );
}